

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

void sysbvm_heap_sweep(sysbvm_heap_t *heap)

{
  sysbvm_heap_mallocObjectHeader_t *__ptr;
  sysbvm_heap_mallocObjectHeader_s *psVar1;
  ulong uVar2;
  ulong uVar3;
  
  __ptr = heap->firstMallocObject;
  heap->firstMallocObject = (sysbvm_heap_mallocObjectHeader_t *)0x0;
  heap->lastMallocObject = (sysbvm_heap_mallocObjectHeader_t *)0x0;
  while (__ptr != (sysbvm_heap_mallocObjectHeader_t *)0x0) {
    psVar1 = (__ptr->field_0).field_0.next;
    (__ptr->field_0).field_0.next = (sysbvm_heap_mallocObjectHeader_s *)0x0;
    if ((__ptr[1].field_0.field_0.size & 3) == heap->gcBlackColor) {
      if (heap->firstMallocObject == (sysbvm_heap_mallocObjectHeader_t *)0x0) {
        heap->lastMallocObject = __ptr;
        heap->firstMallocObject = __ptr;
        __ptr = psVar1;
      }
      else {
        (heap->lastMallocObject->field_0).field_0.next = __ptr;
        heap->lastMallocObject = __ptr;
        __ptr = psVar1;
      }
    }
    else {
      uVar3 = heap->totalSize;
      uVar2 = (ulong)(__ptr->field_0).field_0.size;
      if (uVar3 < uVar2) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/heap.c:185: assertion failure: heap->totalSize >= position->size"
                  );
        uVar2 = (ulong)(__ptr->field_0).field_0.size;
        uVar3 = heap->totalSize;
      }
      heap->totalSize = uVar3 - uVar2;
      free(__ptr);
      __ptr = psVar1;
    }
  }
  heap->shouldAttemptToCollect = false;
  uVar3 = 0x800000;
  if (0x800000 < heap->totalSize) {
    uVar3 = heap->totalSize;
  }
  heap->nextGCSizeThreshold = uVar3 * 3;
  return;
}

Assistant:

void sysbvm_heap_sweep(sysbvm_heap_t *heap)
{
    sysbvm_heap_performSweep(heap);
    sysbvm_heap_computeNextCollectionThreshold(heap);
}